

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
readCode(string *fname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  ostream *poVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  fstream f;
  byte abStack_1218 [496];
  char buf [4096];
  
  std::fstream::fstream(&f);
  std::fstream::open((string *)&f,(_Ios_Openmode)in_RSI);
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
  __p->_M_string_length = 0;
  (__p->field_2)._M_local_buf[0] = '\0';
  std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::__cxx11::string,void>
            ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)fname,__p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"File ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," is not exist");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    while ((abStack_1218[*(long *)(_f + -0x18)] & 2) == 0) {
      std::istream::getline((char *)&f,(long)buf);
      std::__cxx11::string::append((fname->_M_dataplus)._M_p);
      std::__cxx11::string::append((fname->_M_dataplus)._M_p);
    }
    std::fstream::close();
  }
  std::fstream::~fstream(&f);
  sVar3.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = fname;
  return (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )sVar3.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<string> readCode(const string &fname) {
    fstream f;
    f.open(fname, ios::in);
    shared_ptr<string> s(new string());
    char buf[4096];
    if (f.is_open()) {
        while (!f.eof()) {
            f.getline(buf, sizeof(buf) / sizeof(char));
            s->append(buf);
            s->append("\n");
        }
        f.close();
    } else {
        cout << "File " << fname << " is not exist" << endl;
    }
    return s;
}